

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O3

void __thiscall xmrig::CpuThreads::CpuThreads(CpuThreads *this,size_t count,uint32_t intensity)

{
  pointer *ppCVar1;
  iterator __position;
  CpuThread local_38;
  
  this->m_format = ArrayFormat;
  this->m_affinity = -1;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::reserve(&this->m_data,count);
  if (count != 0) {
    do {
      local_38.m_affinity = -1;
      __position._M_current =
           (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38.m_intensity = intensity;
        std::vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>>::
        _M_realloc_insert<xmrig::CpuThread_const&>
                  ((vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>> *)&this->m_data,
                   __position,&local_38);
      }
      else {
        (__position._M_current)->m_affinity = -1;
        *(ulong *)&(__position._M_current)->m_intensity = CONCAT44(local_38._12_4_,intensity);
        ppCVar1 = &(this->m_data).
                   super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

xmrig::CpuThreads::CpuThreads(size_t count, uint32_t intensity)
{
    m_data.reserve(count);

    for (size_t i = 0; i < count; ++i) {
        add(-1, intensity);
    }
}